

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

double flatbuffers::JsonPrinter::GetFieldDefault<double>(FieldDef *fd)

{
  char *s;
  bool bVar1;
  double dStack_18;
  bool check;
  double val;
  FieldDef *fd_local;
  
  dStack_18 = 0.0;
  val = (double)fd;
  s = (char *)std::__cxx11::string::c_str();
  bVar1 = StringToNumber<double>(s,&stack0xffffffffffffffe8);
  if (bVar1) {
    return dStack_18;
  }
  __assert_fail("check",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_text.cpp"
                ,0xfb,
                "static T flatbuffers::JsonPrinter::GetFieldDefault(const FieldDef &) [T = double]")
  ;
}

Assistant:

static T GetFieldDefault(const FieldDef &fd) {
    T val{};
    auto check = StringToNumber(fd.value.constant.c_str(), &val);
    (void)check;
    FLATBUFFERS_ASSERT(check);
    return val;
  }